

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O0

void __thiscall xmrig::NetworkState::NetworkState(NetworkState *this)

{
  void *in_RDI;
  
  memset(in_RDI,0,0x100);
  memset((void *)((long)in_RDI + 0x100),0,0x50);
  *(undefined8 *)((long)in_RDI + 0x150) = 0;
  *(undefined8 *)((long)in_RDI + 0x158) = 0;
  *(undefined8 *)((long)in_RDI + 0x160) = 0;
  *(undefined8 *)((long)in_RDI + 0x168) = 0;
  *(undefined8 *)((long)in_RDI + 0x170) = 0;
  *(undefined1 *)((long)in_RDI + 0x178) = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x2377e6);
  String::String((String *)((long)in_RDI + 0x198));
  String::String((String *)((long)in_RDI + 0x1a8));
  String::String((String *)((long)in_RDI + 0x1b8));
  return;
}

Assistant:

xmrig::NetworkState::NetworkState() :
    pool(),
    accepted(0),
    diff(0),
    failures(0),
    rejected(0),
    total(0),
    m_active(false)
{
}